

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_createinstance(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQInstance *x;
  SQRESULT SVar2;
  SQObjectPtr *o;
  SQObjectPtr local_20;
  
  o = (SQObjectPtr *)0x0;
  bVar1 = sq_aux_gettypedarg(v,idx,OT_CLASS,&o);
  if (bVar1) {
    x = SQClass::CreateInstance((o->super_SQObject)._unVal.pClass);
    SQObjectPtr::SQObjectPtr(&local_20,x);
    SQVM::Push(v,&local_20);
    SQObjectPtr::~SQObjectPtr(&local_20);
    SVar2 = 0;
  }
  else {
    SVar2 = -1;
  }
  return SVar2;
}

Assistant:

SQRESULT sq_createinstance(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    v->Push(_class(*o)->CreateInstance());
    return SQ_OK;
}